

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall
dg::pta::PointerIdPointsToSet::pointsToTarget(PointerIdPointsToSet *this,PSNode *target)

{
  bool bVar1;
  __node_type *in_RSI;
  Pointer *ptr;
  unsigned_long ptrid;
  const_iterator __end2;
  const_iterator __begin2;
  PointersT *__range2;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)in_stack_ffffffffffffffa0);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::end((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
         *)in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) {
      return false;
    }
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator*(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = (const_iterator *)getPointer(0x16cac4);
    if ((in_stack_ffffffffffffffa0->container_it).
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur ==
        in_RSI) break;
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(in_stack_ffffffffffffffa0);
  }
  return true;
}

Assistant:

bool pointsToTarget(PSNode *target) const {
        for (auto ptrid : pointers) {
            const auto &ptr = getPointer(ptrid);
            if (ptr.target == target) {
                return true;
            }
        }
        return false;
    }